

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execLea<(moira::Instr)67,(moira::Mode)5,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint n;
  u32 uVar2;
  ushort in_SI;
  Moira *in_RDI;
  int dst;
  int src;
  undefined2 in_stack_fffffffffffffff4;
  
  n = (int)(uint)in_SI >> 9 & 7;
  uVar2 = computeEA<(moira::Mode)5,(moira::Size)4,0ul>
                    ((Moira *)(CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,(uint)in_SI)) &
                              0xffffffff00000007),n);
  *(u32 *)((long)in_RDI->exec + (long)(int)n * 4 + -0x38) = uVar2;
  bVar1 = isIdxMode(MODE_DI);
  if (bVar1) {
    (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
  }
  prefetch<4ul>(in_RDI);
  return;
}

Assistant:

void
Moira::execLea(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    reg.a[dst] = computeEA<M,S>(src);
    if (isIdxMode(M)) sync(2);

    prefetch<POLLIPL>();
}